

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void kj::_::Debug::
     log<char_const(&)[49],kj::_::DebugComparison<unsigned_long,unsigned_int&>&,kj::ArrayPtr<unsigned_long_const>&,kj::ArrayPtr<unsigned_long_const>&,kj::ArrayPtr<void*const>&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [49],
               DebugComparison<unsigned_long,_unsigned_int_&> *params_1,
               ArrayPtr<const_unsigned_long> *params_2,ArrayPtr<const_unsigned_long> *params_3,
               ArrayPtr<void_*const> *params_4)

{
  undefined4 in_register_00000014;
  DebugComparison<unsigned_long,_unsigned_int_&> *params_00;
  ArrayPtr<const_unsigned_long> *params_01;
  ArrayPtr<const_unsigned_long> *params_02;
  ArrayPtr<void_*const> *params_03;
  ArrayPtr<kj::String> AVar1;
  ArrayPtr<kj::String> in_stack_fffffffffffffec8;
  ArrayDisposer **local_100;
  undefined1 local_a8 [8];
  String argValues [5];
  DebugComparison<unsigned_long,_unsigned_int_&> *params_local_1;
  char (*params_local) [49];
  char *macroArgs_local;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  
  argValues[4].content.disposer = (ArrayDisposer *)params_1;
  str<char_const(&)[49]>
            ((String *)local_a8,(kj *)params,(char (*) [49])CONCAT44(in_register_00000014,severity))
  ;
  str<kj::_::DebugComparison<unsigned_long,unsigned_int&>&>
            ((String *)&argValues[0].content.disposer,(kj *)argValues[4].content.disposer,params_00)
  ;
  str<kj::ArrayPtr<unsigned_long_const>&>
            ((String *)&argValues[1].content.disposer,(kj *)params_2,params_01);
  str<kj::ArrayPtr<unsigned_long_const>&>
            ((String *)&argValues[2].content.disposer,(kj *)params_3,params_02);
  str<kj::ArrayPtr<void*const>&>((String *)&argValues[3].content.disposer,(kj *)params_4,params_03);
  AVar1 = arrayPtr<kj::String>((String *)local_a8,5);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)AVar1.ptr,in_stack_fffffffffffffec8);
  local_100 = &argValues[4].content.disposer;
  do {
    local_100 = local_100 + -3;
    String::~String((String *)local_100);
  } while (local_100 != (ArrayDisposer **)local_a8);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}